

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void DefineSourceFileProperty(void *arg,char *name,char *briefDocs,char *longDocs,int chained)

{
  cmState *this;
  allocator<char> local_51;
  string local_50;
  
  this = cmMakefile::GetState((cmMakefile *)arg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  cmState::DefineProperty(this,&local_50,SOURCE_FILE,briefDocs,longDocs,chained != 0);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CCONV DefineSourceFileProperty(void* arg, const char* name,
                                    const char* briefDocs,
                                    const char* longDocs, int chained)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->GetState()->DefineProperty(name, cmProperty::SOURCE_FILE, briefDocs,
                                 longDocs, chained != 0);
}